

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void findConstInWhere(WhereConst *pConst,Expr *pExpr)

{
  Expr *p;
  int iVar1;
  CollSeq *pCVar2;
  Expr *pValue;
  Expr *pRight;
  
  while( true ) {
    if (pExpr == (Expr *)0x0) {
      return;
    }
    if ((pExpr->flags & 1) != 0) {
      return;
    }
    if (pExpr->op != ',') break;
    findConstInWhere(pConst,pExpr->pRight);
    pExpr = pExpr->pLeft;
  }
  if (pExpr->op == '5') {
    p = pExpr->pLeft;
    pRight = pExpr->pRight;
    if (((pRight->op == 0x9e) && ((pRight->flags & 8) == 0)) &&
       (iVar1 = sqlite3ExprIsConstant(p), iVar1 != 0)) {
      pCVar2 = sqlite3BinaryCompareCollSeq(pConst->pParse,p,pRight);
      iVar1 = sqlite3IsBinary(pCVar2);
      pValue = p;
      if (iVar1 != 0) goto LAB_0016ea76;
    }
    if (((p->op == 0x9e) && ((p->flags & 8) == 0)) &&
       (iVar1 = sqlite3ExprIsConstant(pRight), iVar1 != 0)) {
      pCVar2 = sqlite3BinaryCompareCollSeq(pConst->pParse,p,pRight);
      iVar1 = sqlite3IsBinary(pCVar2);
      pValue = pRight;
      pRight = p;
      if (iVar1 != 0) {
LAB_0016ea76:
        constInsert(pConst,pRight,pValue);
        return;
      }
    }
  }
  return;
}

Assistant:

static void findConstInWhere(WhereConst *pConst, Expr *pExpr){
  Expr *pRight, *pLeft;
  if( pExpr==0 ) return;
  if( ExprHasProperty(pExpr, EP_FromJoin) ) return;
  if( pExpr->op==TK_AND ){
    findConstInWhere(pConst, pExpr->pRight);
    findConstInWhere(pConst, pExpr->pLeft);
    return;
  }
  if( pExpr->op!=TK_EQ ) return;
  pRight = pExpr->pRight;
  pLeft = pExpr->pLeft;
  assert( pRight!=0 );
  assert( pLeft!=0 );
  if( pRight->op==TK_COLUMN
   && !ExprHasProperty(pRight, EP_FixedCol)
   && sqlite3ExprIsConstant(pLeft)
   && sqlite3IsBinary(sqlite3BinaryCompareCollSeq(pConst->pParse,pLeft,pRight))
  ){
    constInsert(pConst, pRight, pLeft);
  }else
  if( pLeft->op==TK_COLUMN
   && !ExprHasProperty(pLeft, EP_FixedCol)
   && sqlite3ExprIsConstant(pRight)
   && sqlite3IsBinary(sqlite3BinaryCompareCollSeq(pConst->pParse,pLeft,pRight))
  ){
    constInsert(pConst, pLeft, pRight);
  }
}